

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O0

btSimplePair * __thiscall
btHashedSimplePairCache::findPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  btSimplePair *pair;
  uint in_EDX;
  uint in_ESI;
  btHashedSimplePairCache *in_RDI;
  int index;
  int hash;
  int local_20;
  btSimplePair *local_8;
  
  gFindSimplePairs = gFindSimplePairs + 1;
  uVar2 = getHash(in_RDI,in_ESI,in_EDX);
  iVar3 = btAlignedObjectArray<btSimplePair>::capacity(&in_RDI->m_overlappingPairArray);
  uVar2 = uVar2 & iVar3 - 1U;
  iVar3 = btAlignedObjectArray<int>::size(&in_RDI->m_hashTable);
  if ((int)uVar2 < iVar3) {
    piVar4 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar2);
    local_20 = *piVar4;
    while( true ) {
      bVar1 = false;
      if (local_20 != -1) {
        pair = btAlignedObjectArray<btSimplePair>::operator[]
                         (&in_RDI->m_overlappingPairArray,local_20);
        bVar1 = equalsPair(in_RDI,pair,in_ESI,in_EDX);
        bVar1 = !bVar1;
      }
      if (!bVar1) break;
      piVar4 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_20);
      local_20 = *piVar4;
    }
    if (local_20 == -1) {
      local_8 = (btSimplePair *)0x0;
    }
    else {
      local_8 = btAlignedObjectArray<btSimplePair>::operator[]
                          (&in_RDI->m_overlappingPairArray,local_20);
    }
  }
  else {
    local_8 = (btSimplePair *)0x0;
  }
  return local_8;
}

Assistant:

btSimplePair* btHashedSimplePairCache::findPair(int indexA, int indexB)
{
	gFindSimplePairs++;
	
	
	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	if (hash >= m_hashTable.size())
	{
		return NULL;
	}

	int index = m_hashTable[hash];
	while (index != BT_SIMPLE_NULL_PAIR && equalsPair(m_overlappingPairArray[index], indexA, indexB) == false)
	{
		index = m_next[index];
	}

	if (index == BT_SIMPLE_NULL_PAIR)
	{
		return NULL;
	}

	btAssert(index < m_overlappingPairArray.size());

	return &m_overlappingPairArray[index];
}